

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Problem_CGBG_FF.cpp
# Opt level: O2

void __thiscall Problem_CGBG_FF::AddEdge(Problem_CGBG_FF *this,Index hI)

{
  bool bVar1;
  int iVar2;
  reference s;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ostream *poVar3;
  E *this_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *nrElems;
  size_type __n;
  undefined1 auVar4 [16];
  double dVar5;
  undefined1 auVar6 [16];
  allocator_type local_209;
  double local_208;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_200;
  undefined1 local_1f8 [16];
  vector<unsigned_int,_std::allocator<unsigned_int>_> types_e;
  vector<unsigned_int,_std::allocator<unsigned_int>_> actions_e;
  stringstream ss;
  ostream local_1a8 [376];
  
  s = std::vector<Scope,_std::allocator<Scope>_>::at(&this->_m_agentsForHouse_action,(ulong)hI);
  BayesianGameCollaborativeGraphical::AddLRF(&this->super_BayesianGameCollaborativeGraphical,s);
  _ss = 0;
  __n = (long)(s->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
              .super__Vector_impl_data._M_finish -
        (long)(s->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
              .super__Vector_impl_data._M_start >> 2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&actions_e,__n,(value_type_conflict1 *)&ss,(allocator_type *)&types_e);
  iVar2 = (*(this->super_BayesianGameCollaborativeGraphical).
            super_BayesianGameIdenticalPayoffInterface.super_BayesianGameBase.
            super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
            _vptr_Interface_ProblemToPolicyDiscrete[0x23])(this,hI);
  local_200 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)CONCAT44(extraout_var,iVar2);
  _ss = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&types_e,__n,(value_type_conflict1 *)&ss,&local_209);
  iVar2 = (*(this->super_BayesianGameCollaborativeGraphical).
            super_BayesianGameIdenticalPayoffInterface.super_BayesianGameBase.
            super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
            _vptr_Interface_ProblemToPolicyDiscrete[0x23])(this,hI);
  local_200 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)((long)local_200 + 0x80);
  nrElems = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
            (CONCAT44(extraout_var_00,iVar2) + 0x98);
  local_208 = 0.0;
  do {
    dVar5 = ComputeLocalProbability(this,s,&types_e);
    local_1f8._0_8_ = dVar5;
    (*(this->super_BayesianGameCollaborativeGraphical).super_BayesianGameIdenticalPayoffInterface.
      super_BayesianGameBase.super_Interface_ProblemToPolicyDiscretePure.
      super_Interface_ProblemToPolicyDiscrete._vptr_Interface_ProblemToPolicyDiscrete[0x1d])
              (dVar5,this,hI,&types_e);
    bVar1 = IndexTools::Increment(&types_e,nrElems);
    local_208 = local_208 + (double)local_1f8._0_8_;
  } while (!bVar1);
  auVar4._8_8_ = 0x7fffffffffffffff;
  auVar4._0_8_ = 0x7fffffffffffffff;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_208 + -1.0;
  auVar4 = vandpd_avx512vl(auVar6,auVar4);
  if (auVar4._0_8_ < 1e-06) {
    do {
      do {
        ComputeLocalUtility(this,hI,s,&actions_e,&types_e);
        (*(this->super_BayesianGameCollaborativeGraphical).
          super_BayesianGameIdenticalPayoffInterface.super_BayesianGameBase.
          super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
          _vptr_Interface_ProblemToPolicyDiscrete[0x22])(this,hI,&types_e,&actions_e);
        bVar1 = IndexTools::Increment(&types_e,nrElems);
      } while (!bVar1);
      bVar1 = IndexTools::Increment(&actions_e,local_200);
    } while (!bVar1);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&types_e.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&actions_e.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    return;
  }
  local_1f8 = auVar4;
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar3 = std::operator<<(local_1a8,"Joint type probabilities for house ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3," do not sum to 1.0, but to ");
  poVar3 = std::ostream::_M_insert<double>(local_208);
  std::operator<<(poVar3,", a difference of ");
  poVar3 = std::ostream::_M_insert<double>((double)local_1f8._0_8_);
  std::operator<<(poVar3,"!");
  this_00 = (E *)__cxa_allocate_exception(0x28);
  E::E(this_00,&ss);
  __cxa_throw(this_00,&E::typeinfo,E::~E);
}

Assistant:

void Problem_CGBG_FF::AddEdge(Index hI)
{
    const Scope & tupleOfAgents = _m_agentsForHouse_action.at(hI);
#if DEBUGADDEDGE     
    cout << "-------------------------------------"<<endl;
    cout << "Adding payoff component for house "<< hI  << endl
        << "\tscope="<< tupleOfAgents << endl;
    cout << "nr types:"<< SoftPrintVector( this->GetNrTypes() ) << endl;
#endif
    AddLRF(tupleOfAgents);
    //Index e=GetNrLRFs()-1;
    Index e=hI;
    size_t k = tupleOfAgents.size();
    vector<Index> actions_e(k, 0);
    const vector<size_t>& nr_actions = GetBGIPforLRF(e)->GetNrActions();
    vector<Index> types_e(k, 0);
    const vector<size_t>& nr_types = GetBGIPforLRF(e)->GetNrTypes();

#if DEBUGADDEDGE     
    cout<< "\tnr_actions=" << PrintTools::SoftPrintVector(nr_actions) << endl
        << "\tnr_types=" << PrintTools::SoftPrintVector(nr_types) << endl;
    cout << "-------------------------------------"<<endl;
#endif
    double psum = 0.0;
    do{
#if DEBUGPROBS        
        cout << "Computing local type prob. P(" << PrintTools::SoftPrintVector(types_e) << ")..."<<endl;
#endif
        double p = ComputeLocalProbability(tupleOfAgents, types_e);
#if DEBUGPROBS        
        cout << "...P(" << PrintTools::SoftPrintVector(types_e) << ")="<<p<<endl;
#endif
        psum += p;
        SetProbability(e, types_e, p);
    }while(!IndexTools::Increment(types_e, nr_types));
    if(! (abs(psum-1.0)<1e-6))
    {
        stringstream ss;
        ss << "Joint type probabilities for house "<<hI<<" do not sum to 1.0, but to " 
            << psum << ", a difference of " << abs(psum-1) << "!";
        throw E(ss);
    }
    do{
        do{
            SetUtility(e, types_e, actions_e, ComputeLocalUtility(hI, tupleOfAgents,  actions_e, types_e));
        }while(!IndexTools::Increment(types_e, nr_types));
    }while(!IndexTools::Increment(actions_e, nr_actions));
}